

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::Compact(ON_Buffer *this)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  size_t __n;
  uchar *local_48;
  ON_BUFFER_SEGMENT *new_last_segment;
  void *last_buffer;
  ON_BUFFER_SEGMENT *prev_segment;
  ON__UINT64 sizeof_segment_buffer;
  bool rc;
  ON_Buffer *this_local;
  
  if (this->m_buffer_size == 0) {
    ChangeSize(this,0);
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  }
  else if ((((this->m_last_segment != (ON_BUFFER_SEGMENT *)0x0) &&
            (this->m_last_segment->m_segment_position0 < this->m_buffer_size)) &&
           (this->m_buffer_size <= this->m_last_segment->m_segment_position1)) &&
          (this->m_buffer_size != this->m_last_segment->m_segment_position1)) {
    __n = this->m_buffer_size - this->m_last_segment->m_segment_position0;
    pOVar1 = this->m_last_segment->m_prev_segment;
    if ((this->m_last_segment->m_segment_buffer == (uchar *)0x0) ||
       ((ON_BUFFER_SEGMENT *)this->m_last_segment->m_segment_buffer == this->m_last_segment + 1)) {
      local_48 = (uchar *)0x0;
    }
    else {
      local_48 = this->m_last_segment->m_segment_buffer;
    }
    pOVar2 = (ON_BUFFER_SEGMENT *)onrealloc(this->m_last_segment,__n + 0x30);
    if (pOVar2 != (ON_BUFFER_SEGMENT *)0x0) {
      if ((pOVar2 != this->m_last_segment) || (local_48 != (uchar *)0x0)) {
        pOVar2->m_segment_buffer = (uchar *)(pOVar2 + 1);
        if (local_48 != (uchar *)0x0) {
          memcpy(pOVar2->m_segment_buffer,local_48,__n);
          onfree(local_48);
        }
        pOVar2->m_prev_segment = pOVar1;
        pOVar2->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
        if (this->m_first_segment == this->m_last_segment) {
          this->m_first_segment = pOVar2;
        }
        if (this->m_current_segment == this->m_last_segment) {
          this->m_current_segment = pOVar2;
        }
        this->m_last_segment = pOVar2;
        if (pOVar1 != (ON_BUFFER_SEGMENT *)0x0) {
          pOVar1->m_next_segment = this->m_last_segment;
        }
      }
      this->m_last_segment->m_segment_position1 = this->m_buffer_size;
    }
  }
  return true;
}

Assistant:

bool ON_Buffer::Compact()
{
  bool rc = false;
  if ( 0 == m_buffer_size )
  {
    rc = ChangeSize(0); // frees all heap and zeros everything but m_current_position.
    m_current_segment = 0;
  }
  else if ( 0 != m_last_segment 
            && m_buffer_size > m_last_segment->m_segment_position0
            && m_buffer_size <= m_last_segment->m_segment_position1
            )
  {
    if ( m_buffer_size == m_last_segment->m_segment_position1 )
      rc = true;
    else
    {
      ON__UINT64 sizeof_segment_buffer = m_buffer_size - m_last_segment->m_segment_position0;
      struct ON_BUFFER_SEGMENT* prev_segment = m_last_segment->m_prev_segment;
      void* last_buffer = ( 0 != m_last_segment->m_segment_buffer && m_last_segment->m_segment_buffer != (unsigned char*)(m_last_segment+1) )
                        ? m_last_segment->m_segment_buffer
                        : 0;
      struct ON_BUFFER_SEGMENT* new_last_segment = (struct ON_BUFFER_SEGMENT*)onrealloc(m_last_segment,sizeof(*m_last_segment) + ((size_t)sizeof_segment_buffer)); // sizeof_segment_buffer always < 0xFFFFFFFF
      if ( 0 != new_last_segment )
      {
        if ( new_last_segment != m_last_segment || 0 != last_buffer )
        {
          new_last_segment->m_segment_buffer = (unsigned char*)(new_last_segment+1);
          if ( 0 != last_buffer )
          {
            memcpy(new_last_segment->m_segment_buffer,last_buffer,(size_t)sizeof_segment_buffer);
            onfree(last_buffer);
            last_buffer = 0;
          }
          new_last_segment->m_prev_segment = prev_segment;
          new_last_segment->m_next_segment = 0;
          if ( m_first_segment == m_last_segment )
            m_first_segment = new_last_segment;
          if ( m_current_segment == m_last_segment )
            m_current_segment = new_last_segment;
          m_last_segment = new_last_segment;
          if ( 0 != prev_segment )
          {
            prev_segment->m_next_segment = m_last_segment;
          }
        }
        m_last_segment->m_segment_position1 = m_buffer_size;
        rc = true;
      }
    }
  }
  return true;
}